

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-bi.c
# Opt level: O0

void server_communicate(int descriptor,Arguments *args)

{
  undefined4 *in_RSI;
  int message;
  Benchmarks bench;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  
  setup_benchmarks((Benchmarks *)0x102377);
  for (iVar1 = 0; iVar1 < (int)in_RSI[1]; iVar1 = iVar1 + 1) {
    now();
    eventfd_wait(in_stack_ffffffffffffffc4,CONCAT44(iVar1,in_stack_ffffffffffffffb8));
    eventfd_notify(in_stack_ffffffffffffffc4,CONCAT44(iVar1,in_stack_ffffffffffffffb8));
    benchmark((Benchmarks *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  *in_RSI = 1;
  evaluate((Benchmarks *)bench.maximum,(Arguments *)bench.minimum);
  return;
}

Assistant:

void server_communicate(int descriptor, struct Arguments* args) {
	struct Benchmarks bench;
	int message;

	setup_benchmarks(&bench);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		eventfd_wait(descriptor, SERVER_TOKEN);
		eventfd_notify(descriptor, CLIENT_TOKEN);

		benchmark(&bench);
	}

	// The message size is always one (it's just a signal)
	args->size = 1;
	evaluate(&bench, args);
}